

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_hkdf(void)

{
  ptls_hash_algorithm_t *algo;
  ptls_iovec_t info_00;
  int iVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_iovec_t prk_00;
  ptls_iovec_t ikm_00;
  ptls_iovec_t salt;
  char info [11];
  char ikm [23];
  uint8_t okm [42];
  uint8_t prk [64];
  
  ppVar2 = find_cipher(ctx,0x1301);
  algo = ppVar2->hash;
  builtin_strncpy(ikm,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",0x17);
  info[0] = -0x10;
  info[1] = -0xf;
  info[2] = -0xe;
  info[3] = -0xd;
  info[4] = -0xc;
  info[5] = -0xb;
  info[6] = -10;
  info[7] = -9;
  info[8] = -8;
  info[9] = -7;
  info[10] = '\0';
  ikm_00.len = 0x16;
  ikm_00.base = (uint8_t *)ikm;
  salt.len = 0xd;
  salt.base = "";
  ptls_hkdf_extract(algo,prk,salt,ikm_00);
  iVar1 = bcmp(prk,anon_var_dwarf_d612,0x20);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x79);
  info_00.len = 10;
  info_00.base = (uint8_t *)info;
  prk_00.len = algo->digest_size;
  prk_00.base = prk;
  ptls_hkdf_expand(algo,okm,0x2a,prk_00,info_00);
  iVar1 = bcmp(okm,anon_var_dwarf_d61d,0x2a);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x7f);
  return;
}

Assistant:

static void test_hkdf(void)
{
    ptls_hash_algorithm_t *sha256 = find_cipher(ctx, PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)->hash;
    const char salt[] = "\x00\x01\x02\x03\x04\x05\x06\x07\x08\x09\x0a\x0b\x0c";
    const char ikm[] = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b";
    const char info[] = "\xf0\xf1\xf2\xf3\xf4\xf5\xf6\xf7\xf8\xf9";
    uint8_t prk[PTLS_MAX_DIGEST_SIZE];
    uint8_t okm[42];

    ptls_hkdf_extract(sha256, prk, ptls_iovec_init(salt, sizeof(salt) - 1), ptls_iovec_init(ikm, sizeof(ikm) - 1));
    ok(memcmp(prk,
              "\x07\x77\x09\x36\x2c\x2e\x32\xdf\x0d\xdc\x3f\x0d\xc4\x7b\xba\x63\x90\xb6\xc7\x3b\xb5\x0f\x9c\x31\x22\xec\x84"
              "\x4a\xd7\xc2\xb3\xe5",
              32) == 0);

    ptls_hkdf_expand(sha256, okm, sizeof(okm), ptls_iovec_init(prk, sha256->digest_size), ptls_iovec_init(info, sizeof(info) - 1));
    ok(memcmp(okm,
              "\x3c\xb2\x5f\x25\xfa\xac\xd5\x7a\x90\x43\x4f\x64\xd0\x36\x2f\x2a\x2d\x2d\x0a\x90\xcf\x1a\x5a\x4c\x5d\xb0\x2d"
              "\x56\xec\xc4\xc5\xbf\x34\x00\x72\x08\xd5\xb8\x87\x18\x58\x65",
              sizeof(okm)) == 0);
}